

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

LY_ERR ly_err_new(ly_err_item **err,LY_ERR ecode,LY_VECODE vecode,char *data_path,char *apptag,
                 char *err_format,...)

{
  char in_AL;
  int iVar1;
  ly_err_item *plVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ly_err_item *local_120;
  undefined1 local_118 [48];
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list print_args;
  ly_err_item *e;
  char *msg;
  char *err_format_local;
  char *apptag_local;
  char *data_path_local;
  LY_VECODE vecode_local;
  LY_ERR ecode_local;
  ly_err_item **err_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  e = (ly_err_item *)0x0;
  err_local._4_4_ = ecode;
  if ((err != (ly_err_item **)0x0) && (ecode != LY_SUCCESS)) {
    msg = err_format;
    err_format_local = apptag;
    apptag_local = data_path;
    data_path_local._0_4_ = vecode;
    data_path_local._4_4_ = ecode;
    _vecode_local = err;
    plVar2 = (ly_err_item *)calloc(1,0x48);
    if (plVar2 == (ly_err_item *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_err_new");
      err_local._4_4_ = LY_EMEM;
    }
    else {
      local_120 = plVar2;
      if (*_vecode_local != (ly_err_item *)0x0) {
        local_120 = (*_vecode_local)->prev;
      }
      plVar2->prev = local_120;
      if (*_vecode_local != (ly_err_item *)0x0) {
        (*_vecode_local)->prev->next = plVar2;
      }
      plVar2->level = LY_LLERR;
      plVar2->err = data_path_local._4_4_;
      plVar2->vecode = (LY_VECODE)data_path_local;
      plVar2->data_path = apptag_local;
      plVar2->apptag = err_format_local;
      if (msg != (char *)0x0) {
        print_args[0].overflow_arg_area = local_118;
        print_args[0]._0_8_ = &stack0x00000008;
        local_64 = 0x30;
        local_68 = 0x30;
        iVar1 = vasprintf((char **)&e,msg,&local_68);
        if (iVar1 == -1) {
          e = (ly_err_item *)0x0;
        }
      }
      plVar2->msg = (char *)e;
      if (*_vecode_local == (ly_err_item *)0x0) {
        *_vecode_local = plVar2;
      }
      err_local._4_4_ = plVar2->err;
    }
  }
  return err_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_err_new(struct ly_err_item **err, LY_ERR ecode, LY_VECODE vecode, char *data_path, char *apptag,
        const char *err_format, ...)
{
    char *msg = NULL;
    struct ly_err_item *e;

    if (!err || (ecode == LY_SUCCESS)) {
        /* nothing to do */
        return ecode;
    }

    e = calloc(1, sizeof *e);
    LY_CHECK_ERR_RET(!e, LOGMEM(NULL), LY_EMEM);

    e->prev = (*err) ? (*err)->prev : e;
    if (*err) {
        (*err)->prev->next = e;
    }

    /* fill in the information */
    e->level = LY_LLERR;
    e->err = ecode;
    e->vecode = vecode;
    e->data_path = data_path;
    e->apptag = apptag;

    if (err_format) {
        va_list print_args;

        va_start(print_args, err_format);

        if (vasprintf(&msg, err_format, print_args) == -1) {
            /* we don't have anything more to do, just set msg to NULL to avoid undefined content,
             * still keep the information about the original error instead of LY_EMEM or other printf's error */
            msg = NULL;
        }

        va_end(print_args);
    }
    e->msg = msg;

    if (!(*err)) {
        *err = e;
    }

    return e->err;
}